

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_A_Look2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  FState *pFVar1;
  AActor *pAVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  bool local_7a;
  bool local_77;
  TFlags<ActorFlag4,_unsigned_int> local_74;
  TFlags<ActorFlag4,_unsigned_int> local_70;
  TFlags<ActorFlag,_unsigned_int> local_6c;
  TFlags<ActorFlag,_unsigned_int> local_68;
  TFlags<ActorFlag,_unsigned_int> local_64;
  TFlags<ActorFlag,_unsigned_int> local_60;
  TFlags<ActorFlag5,_unsigned_int> local_5c;
  AActor *local_58;
  AActor *targ;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar6) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_77 = true;
    if (stateowner != (AActor *)0x0) {
      local_77 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_77 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar6 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar6 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar6 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar6) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_7a = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_7a = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_7a == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar6 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar6 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar6 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar6) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      targ = (AActor *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      targ = (AActor *)0x0;
    }
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_5c,
               (int)stateowner +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
    if (uVar3 != 0) {
      return 0;
    }
    stateowner->threshold = 0;
    local_58 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->LastHeard);
    if ((local_58 != (AActor *)0x0) && (local_58->health < 1)) {
      local_58 = (AActor *)0x0;
    }
    bVar6 = false;
    if (local_58 != (AActor *)0x0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_60,
                 (int)local_58 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
      bVar6 = uVar3 != 0;
    }
    if (bVar6) {
      bVar6 = true;
      if ((level.flags & 0x20000000) == 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_64,
                   (int)stateowner + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_68,
                   (int)local_58 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
        bVar6 = uVar3 != uVar4;
      }
      pAVar2 = stateowner;
      if (bVar6) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_6c,
                   (int)stateowner + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
        if ((uVar3 == 0) || (bVar6 = P_CheckSight(stateowner,local_58,4), bVar6)) {
          TObjPtr<AActor>::operator=(&stateowner->target,local_58);
          stateowner->threshold = 10;
          AActor::SetState(stateowner,stateowner->SeeState,false);
          return 0;
        }
      }
      else {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_70,
                   (int)stateowner +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
        bVar6 = P_LookForPlayers(pAVar2,uVar3,(FLookExParams *)0x0);
        if (((bVar6 ^ 0xffU) & 1) == 0) {
          AActor::SetState(stateowner,stateowner->SeeState,false);
          TFlags<ActorFlag4,_unsigned_int>::operator|=(&stateowner->flags4,MF4_INCOMBAT);
          return 0;
        }
      }
    }
    iVar5 = FRandom::operator()(&pr_look2);
    pAVar2 = stateowner;
    if (iVar5 < 0x1e) {
      pFVar1 = stateowner->SpawnState;
      uVar3 = FRandom::operator()(&pr_look2);
      AActor::SetState(pAVar2,pFVar1 + (long)(int)(uVar3 & 1) + 1,false);
    }
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_74,
               (int)stateowner + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    bVar6 = false;
    if (uVar3 == 0) {
      iVar5 = FRandom::operator()(&pr_look2);
      bVar6 = iVar5 < 0x28;
    }
    if (bVar6) {
      AActor::SetState(stateowner,stateowner->SpawnState + 3,false);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}